

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall imrt::Station::writeIntensity(Station *this,ifstream *myfile)

{
  int iVar1;
  int j;
  long lVar2;
  int i;
  long lVar3;
  double dVar4;
  double intensity;
  double local_30;
  
  lVar3 = 0;
  while( true ) {
    iVar1 = Collimator::getXdim(this->collimator);
    if (iVar1 <= lVar3) break;
    lVar2 = 0;
    while( true ) {
      iVar1 = Collimator::getYdim(this->collimator);
      if (iVar1 <= lVar2) break;
      dVar4 = (this->I).p[lVar3][lVar2];
      if ((dVar4 != -1.0) || (NAN(dVar4))) {
        std::istream::_M_extract<double>((double *)myfile);
        dVar4 = (double)this->step_intensity;
        local_30 = (double)((int)((dVar4 * 0.5 + local_30) / dVar4) * this->step_intensity);
        change_intensity(this,(int)lVar3,(int)lVar2,local_30,
                         (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         0x0);
      }
      lVar2 = lVar2 + 1;
    }
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void Station::writeIntensity(ifstream& myfile) {

	  for (int i=0; i<collimator.getXdim();i++) {
		  for (int j=0; j<collimator.getYdim(); j++) {
			  if(I(i,j)!=-1){
				  double intensity;
				  myfile >> intensity;
          intensity=(int) ((intensity + step_intensity/2.0)/step_intensity)*step_intensity;

				  change_intensity(i, j, (int) (intensity));
			  }
		  }
	  }
  }